

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.hpp
# Opt level: O2

bool Shell::pushFirstPremiseToAnswerIfFromResolver(Inference *inf,Stack<Kernel::Clause_*> *answer)

{
  bool bVar1;
  Unit *this;
  Clause *cl;
  Iterator it;
  anon_union_8_2_756040a0_for_Iterator_0 local_18;
  
  local_18.pointer = (void *)((ulong)(byte)inf->field_0x1 << 8);
  if (local_18.integer != 0x4500) {
    return false;
  }
  local_18 = (anon_union_8_2_756040a0_for_Iterator_0)Kernel::Inference::iterator(inf);
  this = Kernel::Inference::next(inf,(Iterator *)&local_18);
  cl = Kernel::Unit::asClause(this);
  bVar1 = isProperAnswerClause(cl);
  if (bVar1) {
    Lib::Stack<Kernel::Clause_*>::push(answer,cl);
  }
  return bVar1;
}

Assistant:

InferenceRule rule() const { return _rule; }